

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall yactfr::internal::JsonDstFragValReq::JsonDstFragValReq(JsonDstFragValReq *this)

{
  JsonAnyFullDtValReq *anyFullDtValReq;
  bool isRequired;
  bool isRequired_00;
  long lVar1;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 allowNull;
  undefined1 local_2cf;
  undefined1 local_2ce;
  undefined1 local_2cd;
  allocator local_2cc;
  allocator local_2cb;
  allocator local_2ca;
  allocator local_2c9;
  Sp local_2c8;
  type in_stack_fffffffffffffd48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_1e8;
  PropReqsEntry local_1b0;
  PropReqsEntry local_178 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_108;
  PropReqsEntry local_d0;
  PropReqsEntry local_98;
  PropReqsEntry local_60;
  
  allowNull = (undefined1)((ulong)in_stack_fffffffffffffd28 >> 0x38);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_00360cf8;
  std::__cxx11::string::string((string *)&local_240,"data-stream-class",&local_2c9);
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (&local_1b0,(_anonymous_namespace_ *)0x0,isRequired);
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_178,(_anonymous_namespace_ *)0x0,isRequired_00);
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  JsonValReq::shared((optional<yactfr::internal::JsonValKind>)in_stack_fffffffffffffd48,
                     (bool)allowNull);
  JsonObjValPropReq::JsonObjValPropReq
            ((JsonObjValPropReq *)&stack0xfffffffffffffd48,&local_2c8,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>
            (&local_108,&strs::defCcId,(JsonObjValPropReq *)&stack0xfffffffffffffd48);
  std::__cxx11::string::string((string *)&local_260,"packet-context-field-class",&local_2ca);
  anyFullDtValReq = &this->_anyFullDtValReq;
  anon_unknown_0::anyDtPropReqEntry(&local_d0,&local_260,anyFullDtValReq,false);
  std::__cxx11::string::string((string *)&local_280,"event-record-header-field-class",&local_2cb);
  anon_unknown_0::anyDtPropReqEntry(&local_98,&local_280,anyFullDtValReq,false);
  std::__cxx11::string::string
            ((string *)&local_2a0,"event-record-common-context-field-class",&local_2cc);
  anon_unknown_0::anyDtPropReqEntry(&local_60,&local_2a0,anyFullDtValReq,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_220,&local_1e8,&stack0xffffffffffffffd8,0,&local_2cd,&local_2ce,&local_2cf);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_240,(PropReqs *)&local_220);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_220);
  lVar1 = 0x188;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
             *)((long)&local_1e8.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x38);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.
              super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_240);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_00360cf8;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(anyFullDtValReq);
  return;
}

Assistant:

explicit JsonDstFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::defCcId, {JsonValReq::shared(JsonVal::Kind::Str)}},
            anyDtPropReqEntry(strs::pktCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erHeaderFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erCommonCtxFc, _anyFullDtValReq), //-V1050
        }}
    {
    }